

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O1

void stack_5_3::test_stack(void)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  long lVar3;
  undefined4 *puVar4;
  undefined4 *unaff_R15;
  
  lVar3 = 0;
  puVar4 = (undefined4 *)0x0;
  do {
    puVar1 = (undefined4 *)malloc(0x10);
    *puVar1 = *(undefined4 *)((long)&DAT_00105170 + lVar3);
    *(undefined8 *)(puVar1 + 2) = 0;
    puVar2 = puVar1;
    if (puVar4 != (undefined4 *)0x0) {
      *(undefined4 **)(unaff_R15 + 2) = puVar1;
      puVar2 = puVar4;
    }
    lVar3 = lVar3 + 4;
    puVar4 = puVar2;
    unaff_R15 = puVar1;
  } while( true );
}

Assistant:

void test() {
        linklist_5_3::LinkList list;
        int aa[] = {1, 2, 3, 2, 1};
        list = linklist_5_3::create(aa, 3, 5);
        linklist_5_3::LinkList a = (linklist_5_3::LinkList) malloc(sizeof(linklist_5_3::node));
        a->next = list;
        semmetry(a, 5);

    }